

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

INTN findPattern(UINT8 *pattern,UINT8 *patternMask,UINTN patternSize,UINT8 *data,UINTN dataSize,
                UINTN dataOff)

{
  long lVar1;
  UINT8 *pUVar2;
  UINTN UVar3;
  
  if (dataOff + patternSize <= dataSize &&
      (patternSize - 1 < dataSize - dataOff && dataOff < dataSize)) {
    pUVar2 = data + dataOff;
    do {
      UVar3 = 0;
      while ((patternMask[UVar3] & pUVar2[UVar3]) == pattern[UVar3]) {
        UVar3 = UVar3 + 1;
        if (patternSize == UVar3) {
          return dataOff;
        }
      }
      lVar1 = dataOff + patternSize;
      dataOff = dataOff + 1;
      pUVar2 = pUVar2 + 1;
    } while (lVar1 + 1U <= dataSize);
  }
  return -1;
}

Assistant:

INTN findPattern(const UINT8 *pattern, const UINT8 *patternMask, UINTN patternSize,
                 const UINT8 *data, UINTN dataSize, UINTN dataOff)
{
    if (patternSize == 0 || dataSize == 0 || dataOff >= dataSize || dataSize - dataOff < patternSize)
        return -1;
    
    while (dataOff + patternSize <= dataSize) {
        bool matches = true;
        for (UINTN i = 0; i < patternSize; i++) {
            if ((data[dataOff + i] & patternMask[i]) != pattern[i]) {
                matches = false;
                break;
            }
        }
        
        if (matches)
            return static_cast<INTN>(dataOff);
        
        dataOff++;
    }
    
    return -1;
}